

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall pstd::pmr::monotonic_buffer_resource::release(monotonic_buffer_resource *this)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->usedBlocks).
                super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->usedBlocks; p_Var1 = p_Var1->_M_next) {
    (*this->upstreamResource->_vptr_memory_resource[3])
              (this->upstreamResource,p_Var1[1]._M_next,p_Var1[1]._M_prev,0x10);
  }
  std::__cxx11::
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ::clear(&this->usedBlocks);
  for (p_Var1 = (this->availableBlocks).
                super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->availableBlocks; p_Var1 = p_Var1->_M_next) {
    (*this->upstreamResource->_vptr_memory_resource[3])
              (this->upstreamResource,p_Var1[1]._M_next,p_Var1[1]._M_prev,0x10);
  }
  std::__cxx11::
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ::clear(&this->availableBlocks);
  (*this->upstreamResource->_vptr_memory_resource[3])
            (this->upstreamResource,(this->currentBlock).ptr,(this->currentBlock).size,0x10);
  (this->currentBlock).ptr = (void *)0x0;
  (this->currentBlock).size = 0;
  return;
}

Assistant:

void release() {
        for (const auto &block : usedBlocks)
            upstreamResource->deallocate(block.ptr, block.size);
        usedBlocks.clear();

        for (const auto &block : availableBlocks)
            upstreamResource->deallocate(block.ptr, block.size);
        availableBlocks.clear();

        upstreamResource->deallocate(currentBlock.ptr, currentBlock.size);
        currentBlock = MemoryBlock();
    }